

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

STObject * __thiscall jbcoin::STObject::operator=(STObject *this,STObject *other)

{
  SField *n;
  STObject *other_local;
  STObject *this_local;
  
  n = STBase::getFName(&other->super_STBase);
  STBase::setFName(&this->super_STBase,n);
  this->mType = other->mType;
  std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::operator=
            (&this->v_,&other->v_);
  return this;
}

Assistant:

STObject&
STObject::operator= (STObject&& other)
{
    setFName(other.getFName());
    mType = other.mType;
    v_ = std::move(other.v_);
    return *this;
}